

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O3

void __thiscall YAML::detail::node_data::reset_map(node_data *this)

{
  kv_pairs *pkVar1;
  pointer ppVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  ppVar2 = (this->m_map).
           super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_map).
      super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_map).
    super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  pkVar1 = &this->m_undefinedPairs;
  p_Var4 = (this->m_undefinedPairs).
           super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)pkVar1) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var3;
  }
  (this->m_undefinedPairs).
  super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pkVar1;
  (this->m_undefinedPairs).
  super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pkVar1;
  (this->m_undefinedPairs).
  super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void node_data::reset_map() {
  m_map.clear();
  m_undefinedPairs.clear();
}